

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picohttpparser.c
# Opt level: O3

ssize_t phr_decode_chunked(phr_chunked_decoder *decoder,char *buf,size_t *_bufsz)

{
  char *pcVar1;
  size_t sVar2;
  char cVar3;
  int iVar4;
  uint uVar5;
  ulong __n;
  ulong __n_00;
  ssize_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  
  sVar2 = *_bufsz;
  cVar3 = decoder->_state;
  sVar8 = 0;
  sVar7 = 0;
LAB_00107345:
  switch(cVar3) {
  case '\0':
    if (sVar8 != sVar2) {
      do {
        iVar4 = (int)buf[sVar8];
        uVar5 = iVar4 - 0x30;
        if (9 < uVar5) {
          if (iVar4 - 0x41U < 6) {
            uVar5 = iVar4 - 0x37;
          }
          else {
            if (iVar4 - 0x67U < 0xfffffffa) goto LAB_00107446;
            uVar5 = iVar4 - 0x57;
          }
        }
        if (decoder->_hex_count == '\x10') goto LAB_00107521;
        decoder->bytes_left_in_chunk = (long)(int)uVar5 + decoder->bytes_left_in_chunk * 0x10;
        decoder->_hex_count = decoder->_hex_count + '\x01';
        sVar8 = sVar8 + 1;
        if (sVar2 == sVar8) break;
      } while( true );
    }
    break;
  case '\x01':
    goto switchD_00107357_caseD_1;
  case '\x02':
    __n = decoder->bytes_left_in_chunk;
    goto LAB_00107496;
  case '\x03':
    goto switchD_00107357_caseD_3;
  case '\x04':
    sVar9 = sVar8;
    do {
      if (sVar9 == sVar2) goto LAB_0010756c;
      sVar8 = sVar9 + 1;
      pcVar1 = buf + sVar9;
      sVar9 = sVar8;
    } while (*pcVar1 == '\r');
    if (*pcVar1 != '\n') {
      decoder->_state = '\x05';
      goto switchD_00107357_caseD_5;
    }
    goto LAB_0010752a;
  case '\x05':
switchD_00107357_caseD_5:
    sVar9 = sVar8;
    do {
      if (sVar9 == sVar2) goto LAB_0010756c;
      sVar8 = sVar9 + 1;
      pcVar1 = buf + sVar9;
      sVar9 = sVar8;
    } while (*pcVar1 != '\n');
    cVar3 = '\x04';
    goto LAB_00107518;
  default:
    __assert_fail("!\"decoder is corrupt\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/mattn[P]clask/clask/../clask/picohttpparser.c"
                  ,0x275,
                  "ssize_t phr_decode_chunked(struct phr_chunked_decoder *, char *, size_t *)");
  }
  goto LAB_0010756c;
LAB_00107446:
  if (decoder->_hex_count == '\0') {
LAB_00107521:
    sVar6 = -1;
  }
  else {
    decoder->_hex_count = '\0';
    decoder->_state = '\x01';
switchD_00107357_caseD_1:
    sVar9 = sVar8;
    if (sVar8 != sVar2) {
      while (sVar8 = sVar9 + 1, buf[sVar9] != '\n') {
        sVar9 = sVar8;
        if (sVar8 == sVar2) goto LAB_0010756c;
      }
      __n = decoder->bytes_left_in_chunk;
      if (__n == 0) {
        cVar3 = '\x04';
        if (decoder->consume_trailer != '\0') {
LAB_00107518:
          decoder->_state = cVar3;
          goto LAB_00107345;
        }
LAB_0010752a:
        sVar6 = sVar2 - sVar8;
        goto LAB_0010756f;
      }
      decoder->_state = '\x02';
LAB_00107496:
      __n_00 = sVar2 - sVar8;
      if (__n_00 < __n) {
        if (sVar7 != sVar8) {
          memmove(buf + sVar7,buf + sVar8,__n_00);
          __n = decoder->bytes_left_in_chunk;
        }
        decoder->bytes_left_in_chunk = __n - __n_00;
        sVar7 = sVar7 + __n_00;
      }
      else {
        if (sVar7 != sVar8) {
          memmove(buf + sVar7,buf + sVar8,__n);
          __n = decoder->bytes_left_in_chunk;
        }
        sVar8 = sVar8 + __n;
        decoder->bytes_left_in_chunk = 0;
        decoder->_state = '\x03';
        sVar7 = sVar7 + __n;
switchD_00107357_caseD_3:
        if (sVar8 != sVar2) {
          while (buf[sVar8] == '\r') {
            sVar8 = sVar8 + 1;
            if (sVar2 == sVar8) goto LAB_0010756c;
          }
          if (buf[sVar8] == '\n') {
            sVar8 = sVar8 + 1;
            cVar3 = '\0';
            goto LAB_00107518;
          }
          goto LAB_00107521;
        }
      }
    }
LAB_0010756c:
    sVar6 = -2;
    sVar8 = sVar2;
  }
LAB_0010756f:
  if (sVar7 != sVar8) {
    memmove(buf + sVar7,buf + sVar8,sVar2 - sVar8);
  }
  *_bufsz = sVar7;
  return sVar6;
}

Assistant:

ssize_t phr_decode_chunked(struct phr_chunked_decoder *decoder, char *buf, size_t *_bufsz)
{
    size_t dst = 0, src = 0, bufsz = *_bufsz;
    ssize_t ret = -2; /* incomplete */

    while (1) {
        switch (decoder->_state) {
        case CHUNKED_IN_CHUNK_SIZE:
            for (;; ++src) {
                int v;
                if (src == bufsz)
                    goto Exit;
                if ((v = decode_hex(buf[src])) == -1) {
                    if (decoder->_hex_count == 0) {
                        ret = -1;
                        goto Exit;
                    }
                    break;
                }
                if (decoder->_hex_count == sizeof(size_t) * 2) {
                    ret = -1;
                    goto Exit;
                }
                decoder->bytes_left_in_chunk = decoder->bytes_left_in_chunk * 16 + v;
                ++decoder->_hex_count;
            }
            decoder->_hex_count = 0;
            decoder->_state = CHUNKED_IN_CHUNK_EXT;
        /* fallthru */
        case CHUNKED_IN_CHUNK_EXT:
            /* RFC 7230 A.2 "Line folding in chunk extensions is disallowed" */
            for (;; ++src) {
                if (src == bufsz)
                    goto Exit;
                if (buf[src] == '\012')
                    break;
            }
            ++src;
            if (decoder->bytes_left_in_chunk == 0) {
                if (decoder->consume_trailer) {
                    decoder->_state = CHUNKED_IN_TRAILERS_LINE_HEAD;
                    break;
                } else {
                    goto Complete;
                }
            }
            decoder->_state = CHUNKED_IN_CHUNK_DATA;
        /* fallthru */
        case CHUNKED_IN_CHUNK_DATA: {
            size_t avail = bufsz - src;
            if (avail < decoder->bytes_left_in_chunk) {
                if (dst != src)
                    memmove(buf + dst, buf + src, avail);
                src += avail;
                dst += avail;
                decoder->bytes_left_in_chunk -= avail;
                goto Exit;
            }
            if (dst != src)
                memmove(buf + dst, buf + src, decoder->bytes_left_in_chunk);
            src += decoder->bytes_left_in_chunk;
            dst += decoder->bytes_left_in_chunk;
            decoder->bytes_left_in_chunk = 0;
            decoder->_state = CHUNKED_IN_CHUNK_CRLF;
        }
        /* fallthru */
        case CHUNKED_IN_CHUNK_CRLF:
            for (;; ++src) {
                if (src == bufsz)
                    goto Exit;
                if (buf[src] != '\015')
                    break;
            }
            if (buf[src] != '\012') {
                ret = -1;
                goto Exit;
            }
            ++src;
            decoder->_state = CHUNKED_IN_CHUNK_SIZE;
            break;
        case CHUNKED_IN_TRAILERS_LINE_HEAD:
            for (;; ++src) {
                if (src == bufsz)
                    goto Exit;
                if (buf[src] != '\015')
                    break;
            }
            if (buf[src++] == '\012')
                goto Complete;
            decoder->_state = CHUNKED_IN_TRAILERS_LINE_MIDDLE;
        /* fallthru */
        case CHUNKED_IN_TRAILERS_LINE_MIDDLE:
            for (;; ++src) {
                if (src == bufsz)
                    goto Exit;
                if (buf[src] == '\012')
                    break;
            }
            ++src;
            decoder->_state = CHUNKED_IN_TRAILERS_LINE_HEAD;
            break;
        default:
            assert(!"decoder is corrupt");
        }
    }

Complete:
    ret = bufsz - src;
Exit:
    if (dst != src)
        memmove(buf + dst, buf + src, bufsz - src);
    *_bufsz = dst;
    return ret;
}